

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

int VP8EncLoop(VP8Encoder *enc)

{
  uint64_t *puVar1;
  int *piVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  VP8RDLevel rd_opt;
  size_t sVar6;
  size_t sVar7;
  score_t sVar8;
  VP8Encoder *pVVar9;
  VP8BitWriter *bw;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint64_t uVar20;
  bool bVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  int16_t (*paiVar28) [16];
  int16_t (*paiVar29) [16];
  bool bVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  bool bVar35;
  bool bVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  VP8Residual res_1;
  VP8Residual res;
  VP8ModeScore info;
  VP8EncIterator it;
  PassStats local_1320;
  double local_12e8;
  double dStack_12e0;
  VP8Residual local_12d8;
  VP8ModeScore local_12a8;
  VP8EncIterator local_f38;
  
  iVar11 = PreLoopInitialize(enc);
  if (iVar11 == 0) {
LAB_00134447:
    iVar11 = 0;
  }
  else {
    iVar11 = enc->method_;
    iVar16 = enc->do_search_;
    iVar17 = ((VP8Encoder *)enc->config_)->num_parts_;
    iVar12 = (iVar17 / 2 + 0x14) / iVar17;
    iVar4 = enc->percent_;
    iVar13 = enc->mb_h_ * enc->mb_w_;
    InitPassStats((VP8Encoder *)enc->config_,&local_1320);
    memset((enc->proba_).stats_,0,0x1080);
    iVar18 = iVar13;
    if ((iVar11 == 3 || iVar11 == 0) && iVar16 == 0) {
      if (iVar11 == 3) {
        iVar14 = iVar13 >> 1;
        iVar18 = 100;
      }
      else {
        iVar14 = iVar13 >> 2;
        iVar18 = 0x32;
      }
      if (200 < iVar13) {
        iVar18 = iVar14;
      }
    }
    if (0 < iVar17) {
      iVar13 = iVar18 * 0x180;
      auVar38._8_4_ = iVar13 >> 0x1f;
      auVar38._0_8_ = (long)iVar13;
      auVar38._12_4_ = 0x45300000;
      dStack_12e0 = auVar38._8_8_ - 1.9342813113834067e+25;
      local_12e8 = (dStack_12e0 + ((double)CONCAT44(0x43300000,iVar13) - 4503599627370496.0)) *
                   65025.0;
      fVar40 = local_1320.dq;
      do {
        iVar13 = iVar17 + -1;
        bVar35 = true;
        if ((0.4 < ABS(fVar40)) && (iVar13 != 0)) {
          bVar35 = enc->max_i4_header_bits_ == 0;
        }
        VP8IteratorInit(enc,&local_f38);
        SetLoopParams(enc,local_1320.q);
        lVar32 = 0;
        lVar34 = 0;
        lVar23 = 0;
        iVar14 = iVar18;
        do {
          VP8IteratorImport(&local_f38,(uint8_t *)0x0);
          iVar15 = VP8Decimate(&local_f38,&local_12a8,(uint)(2 < iVar11 || iVar16 != 0));
          pVVar9 = local_f38.enc_;
          if (iVar15 != 0) {
            piVar2 = &(enc->proba_).nb_skip_;
            *piVar2 = *piVar2 + 1;
          }
          VP8IteratorNzToBytes(&local_f38);
          bVar36 = ((uint)*local_f38.mb_ & 3) != 1;
          if (bVar36) {
            iVar15 = 3;
          }
          else {
            VP8InitResidual(0,1,pVVar9,&local_12d8);
            (*VP8SetResidualCoeffs)(local_12a8.y_dc_levels,&local_12d8);
            local_f38.top_nz_[8] =
                 VP8RecordCoeffs(local_f38.left_nz_[8] + local_f38.top_nz_[8],&local_12d8);
            iVar15 = 0;
            local_f38.left_nz_[8] = local_f38.top_nz_[8];
          }
          VP8InitResidual((uint)!bVar36,iVar15,pVVar9,&local_12d8);
          paiVar28 = local_12a8.y_ac_levels;
          lVar31 = 0;
          do {
            lVar22 = 0x21;
            paiVar29 = paiVar28;
            do {
              iVar15 = local_f38.left_nz_[lVar31];
              iVar5 = *(int *)(local_f38.i4_boundary_ + lVar22 * 4 + -0x50);
              (*VP8SetResidualCoeffs)(*paiVar29,&local_12d8);
              iVar15 = VP8RecordCoeffs(iVar15 + iVar5,&local_12d8);
              local_f38.left_nz_[lVar31] = iVar15;
              *(int *)(local_f38.i4_boundary_ + lVar22 * 4 + -0x50) = iVar15;
              lVar22 = lVar22 + 1;
              paiVar29 = paiVar29 + 1;
            } while (lVar22 != 0x25);
            lVar31 = lVar31 + 1;
            paiVar28 = paiVar28 + 4;
          } while (lVar31 != 4);
          VP8InitResidual(0,2,pVVar9,&local_12d8);
          uVar19 = 0;
          bVar36 = true;
          do {
            bVar10 = bVar36;
            uVar24 = 0;
            bVar36 = true;
            do {
              bVar30 = bVar36;
              uVar33 = uVar24 | uVar19 | 4;
              iVar15 = local_f38.left_nz_[uVar33];
              uVar25 = 0;
              bVar36 = true;
              do {
                bVar21 = bVar36;
                uVar27 = uVar25 | uVar19 | 4;
                iVar5 = local_f38.top_nz_[uVar27];
                (*VP8SetResidualCoeffs)
                          (local_12a8.uv_levels[uVar25 | (uVar24 | uVar19) * 2],&local_12d8);
                iVar15 = VP8RecordCoeffs(iVar15 + iVar5,&local_12d8);
                local_f38.left_nz_[uVar33] = iVar15;
                local_f38.top_nz_[uVar27] = iVar15;
                uVar25 = 1;
                bVar36 = false;
              } while (bVar21);
              uVar24 = 1;
              bVar36 = false;
            } while (bVar30);
            uVar19 = 2;
          } while (bVar10);
          VP8IteratorBytesToNz(&local_f38);
          sVar8 = local_12a8.H;
          lVar32 = lVar32 + local_12a8.R;
          lVar23 = lVar23 + local_12a8.D;
          if ((iVar12 != 0) && (iVar15 = VP8IteratorProgress(&local_f38,iVar12), iVar15 == 0))
          goto LAB_00134043;
          lVar32 = lVar32 + sVar8;
          lVar34 = lVar34 + sVar8;
          VP8IteratorSaveBoundary(&local_f38);
          iVar15 = VP8IteratorNext(&local_f38);
        } while ((iVar15 != 0) && (bVar36 = 1 < iVar14, iVar14 = iVar14 + -1, bVar36));
        uVar19 = lVar34 + (enc->segment_hdr_).size_;
        if (local_1320.do_size_search == 0) {
          dVar37 = 99.0;
          if (lVar23 != 0 && iVar18 != 0) {
            auVar39._8_4_ = (int)((ulong)lVar23 >> 0x20);
            auVar39._0_8_ = lVar23;
            auVar39._12_4_ = 0x45300000;
            dVar37 = log10(local_12e8 /
                           ((auVar39._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0)));
            dVar37 = dVar37 * 10.0;
          }
        }
        else {
          iVar14 = FinalizeSkipProba(enc);
          iVar15 = FinalizeTokenProbas(&enc->proba_);
          dVar37 = (double)(((long)iVar15 + lVar32 + uVar19 + (long)iVar14 + 0x400 >> 0xb) + 0x1e);
        }
        local_1320.value = dVar37;
        if (uVar19 == 0) goto LAB_00134043;
        if (uVar19 < 0x3fc00001 || enc->max_i4_header_bits_ < 1) {
          if ((bVar35) ||
             ((iVar16 != 0 &&
              (ComputeNextQ(&local_1320), fVar40 = local_1320.dq, ABS(local_1320.dq) <= 0.4))))
          break;
        }
        else {
          enc->max_i4_header_bits_ = (uint)enc->max_i4_header_bits_ >> 1;
          iVar13 = iVar17;
        }
        iVar17 = iVar13;
      } while (0 < iVar13);
    }
    if ((iVar16 == 0) || (local_1320.do_size_search == 0)) {
      FinalizeSkipProba(enc);
      FinalizeTokenProbas(&enc->proba_);
    }
    VP8CalculateLevelCosts(&enc->proba_);
    WebPReportProgress(enc->pic_,iVar4 + 0x14,&enc->percent_);
LAB_00134043:
    VP8IteratorInit(enc,&local_f38);
    VP8InitFilter(&local_f38);
    do {
      iVar11 = (enc->proba_).use_skip_proba_;
      rd_opt = enc->rd_opt_level_;
      VP8IteratorImport(&local_f38,(uint8_t *)0x0);
      iVar16 = VP8Decimate(&local_f38,&local_12a8,rd_opt);
      bw = local_f38.bw_;
      pVVar9 = local_f38.enc_;
      if ((iVar16 == 0) || (iVar11 == 0)) {
        bVar3 = *(byte *)local_f38.mb_;
        VP8IteratorNzToBytes(&local_f38);
        iVar11 = bw->nb_bits_;
        sVar6 = bw->pos_;
        iVar16 = bw->run_;
        bVar35 = (bVar3 & 3) != 1;
        if (bVar35) {
          iVar17 = 3;
        }
        else {
          VP8InitResidual(0,1,pVVar9,(VP8Residual *)&local_1320);
          (*VP8SetResidualCoeffs)(local_12a8.y_dc_levels,(VP8Residual *)&local_1320);
          local_f38.top_nz_[8] =
               PutCoeffs(bw,local_f38.left_nz_[8] + local_f38.top_nz_[8],(VP8Residual *)&local_1320)
          ;
          iVar17 = 0;
          local_f38.left_nz_[8] = local_f38.top_nz_[8];
        }
        VP8InitResidual((uint)!bVar35,iVar17,pVVar9,(VP8Residual *)&local_1320);
        paiVar28 = local_12a8.y_ac_levels;
        lVar23 = 0;
        do {
          lVar32 = 0x21;
          paiVar29 = paiVar28;
          do {
            iVar17 = local_f38.left_nz_[lVar23];
            iVar4 = *(int *)(local_f38.i4_boundary_ + lVar32 * 4 + -0x50);
            (*VP8SetResidualCoeffs)(*paiVar29,(VP8Residual *)&local_1320);
            iVar17 = PutCoeffs(bw,iVar17 + iVar4,(VP8Residual *)&local_1320);
            local_f38.left_nz_[lVar23] = iVar17;
            *(int *)(local_f38.i4_boundary_ + lVar32 * 4 + -0x50) = iVar17;
            lVar32 = lVar32 + 1;
            paiVar29 = paiVar29 + 1;
          } while (lVar32 != 0x25);
          lVar23 = lVar23 + 1;
          paiVar28 = paiVar28 + 4;
        } while (lVar23 != 4);
        iVar17 = bw->nb_bits_;
        sVar7 = bw->pos_;
        iVar4 = bw->run_;
        VP8InitResidual(0,2,pVVar9,(VP8Residual *)&local_1320);
        uVar19 = 0;
        bVar35 = true;
        do {
          bVar36 = bVar35;
          uVar24 = 0;
          bVar35 = true;
          do {
            bVar10 = bVar35;
            uVar25 = uVar24 | uVar19 | 4;
            iVar18 = local_f38.left_nz_[uVar25];
            uVar33 = 0;
            bVar35 = true;
            do {
              bVar30 = bVar35;
              uVar27 = uVar33 | uVar19 | 4;
              iVar12 = local_f38.top_nz_[uVar27];
              (*VP8SetResidualCoeffs)
                        (local_12a8.uv_levels[uVar33 | (uVar24 | uVar19) * 2],
                         (VP8Residual *)&local_1320);
              iVar18 = PutCoeffs(bw,iVar18 + iVar12,(VP8Residual *)&local_1320);
              local_f38.left_nz_[uVar25] = iVar18;
              local_f38.top_nz_[uVar27] = iVar18;
              uVar33 = 1;
              bVar35 = false;
            } while (bVar30);
            uVar24 = 1;
            bVar35 = false;
          } while (bVar10);
          uVar19 = 2;
        } while (bVar36);
        lVar23 = (long)iVar17 + (sVar7 + (long)iVar4) * 8 + 8;
        uVar26 = bVar3 >> 5 & 3;
        local_f38.luma_bits_ = (lVar23 - ((long)iVar11 + (sVar6 + (long)iVar16) * 8)) - 8;
        uVar20 = (bw->nb_bits_ - lVar23) + ((long)bw->run_ + bw->pos_) * 8 + 8;
        local_f38.uv_bits_ = uVar20;
        puVar1 = local_f38.bit_count_[uVar26] + ((bVar3 & 3) == 1);
        *puVar1 = *puVar1 + local_f38.luma_bits_;
        puVar1 = local_f38.bit_count_[uVar26] + 2;
        *puVar1 = *puVar1 + uVar20;
        VP8IteratorBytesToNz(&local_f38);
      }
      else if (((uint)*local_f38.mb_ & 3) == 1) {
        *local_f38.nz_ = 0;
        local_f38.left_nz_[8] = 0;
      }
      else {
        *local_f38.nz_ = *local_f38.nz_ & 0x1000000;
      }
      StoreSideInfo(&local_f38);
      VP8StoreFilterStats(&local_f38);
      VP8IteratorExport(&local_f38);
      iVar11 = VP8IteratorProgress(&local_f38,0x14);
      VP8IteratorSaveBoundary(&local_f38);
      if (iVar11 == 0) {
        VP8EncFreeBitWriters(local_f38.enc_);
        goto LAB_00134447;
      }
      iVar16 = VP8IteratorNext(&local_f38);
    } while (iVar16 != 0);
    iVar11 = PostLoopFinalize(&local_f38,iVar11);
  }
  return iVar11;
}

Assistant:

int VP8EncLoop(VP8Encoder* const enc) {
  VP8EncIterator it;
  int ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  StatLoop(enc);  // stats-collection loop

  VP8IteratorInit(enc, &it);
  VP8InitFilter(&it);
  do {
    VP8ModeScore info;
    const int dont_use_skip = !enc->proba_.use_skip_proba_;
    const VP8RDLevel rd_opt = enc->rd_opt_level_;

    VP8IteratorImport(&it, NULL);
    // Warning! order is important: first call VP8Decimate() and
    // *then* decide how to code the skip decision if there's one.
    if (!VP8Decimate(&it, &info, rd_opt) || dont_use_skip) {
      CodeResiduals(it.bw_, &it, &info);
    } else {   // reset predictors after a skip
      ResetAfterSkip(&it);
    }
    StoreSideInfo(&it);
    VP8StoreFilterStats(&it);
    VP8IteratorExport(&it);
    ok = VP8IteratorProgress(&it, 20);
    VP8IteratorSaveBoundary(&it);
  } while (ok && VP8IteratorNext(&it));

  return PostLoopFinalize(&it, ok);
}